

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void * big_alloc(size_t size)

{
  size_t *psVar1;
  size_t len;
  
  len = (ulong)((size + 0x10 & 0xfff) != 0) * 0x1000 + (size + 0x10 & 0xfffffffffffff000);
  psVar1 = (size_t *)sys_alloc(len,'\x01');
  if (psVar1 == (size_t *)0x0) {
    psVar1 = (size_t *)0x0;
  }
  else {
    *psVar1 = len;
    psVar1 = psVar1 + 2;
  }
  return psVar1;
}

Assistant:

static inline void *big_alloc(size_t size) {
  size = sys_round_size(size + 16);
  size_t *mem = sys_alloc(size, 1);
  if (!mem)
    goto error;
  *mem = size;
  return (void *)(((uintptr_t)mem) + 16);
error:
  return NULL;
}